

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall notch::core::EuclideanLoss::EuclideanLoss(EuclideanLoss *this,size_t n)

{
  uint in_EAX;
  undefined8 uStack_18;
  
  (this->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ALossLayer).shared.outputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  (this->super_ALossLayer).shared.inputBuffer.
  super___shared_ptr<std::valarray<float>,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->super_ALossLayer)._vptr_ALossLayer = (_func_int **)&PTR_tag_abi_cxx11__001b19b8;
  this->nSize = n;
  uStack_18 = (ulong)in_EAX;
  std::valarray<float>::valarray(&this->lossGrad,(float *)((long)&uStack_18 + 4),n);
  return;
}

Assistant:

EuclideanLoss(size_t n) : nSize(n), lossGrad(0.0, n) {}